

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es.c
# Opt level: O2

int esMain(int argc,char **argv)

{
  size_t sVar1;
  int iVar2;
  bool_t bVar3;
  u32 uVar4;
  err_t eVar5;
  err_t eVar6;
  size_t sVar7;
  char *pcVar8;
  file_t file;
  ulong uVar9;
  tm_ticks_t tVar10;
  tm_ticks_t tVar11;
  long lVar12;
  ulong w;
  ulong uVar13;
  long lVar14;
  size_t sVar15;
  bool bVar16;
  char source [6];
  size_t local_858;
  file_t local_850;
  ulong local_848;
  size_t local_840;
  octet buf [2048];
  
  if (argc < 2) {
    printf("bee2cmd/%s: %s\nUsage:\n  es print\n    list available entropy sources and determine their health\n  es read <source> <count> <file>\n    read <count> Kbytes from <source> and store them in <file>\n  <source> in {trng, trng2, sys, sys2, timer, timerNN}\n    timerNNN -- use NNN sleep delays to produce one output bit\n"
           ,"es","monitor entropy sources");
    return -1;
  }
  iVar2 = strCmp(argv[1],"print");
  if (iVar2 == 0) {
    eVar6 = 0x25b;
    if (argc == 2) {
      printf("Sources:");
      lVar14 = 0;
      for (lVar12 = 0; lVar12 != 0x28; lVar12 = lVar12 + 8) {
        pcVar8 = *(char **)((long)&PTR_anon_var_dwarf_4a4a_0014e8a0 + lVar12);
        eVar6 = rngESRead((size_t *)buf,(void *)0x0,0,pcVar8);
        if (eVar6 == 0) {
          eVar6 = rngESTest(pcVar8);
          printf(" %s%c",pcVar8,(ulong)((uint)(eVar6 != 0) * 2 + 0x2b));
          lVar14 = lVar14 + 1;
        }
      }
      pcVar8 = "\n";
      if (lVar14 == 0) {
        pcVar8 = " none\n";
      }
      eVar6 = 0;
      printf(pcVar8);
      eVar5 = rngESHealth();
      printf("Health (at least two healthy sources): %c\n",(ulong)((uint)(eVar5 != 0) * 2 + 0x2b));
      eVar5 = rngESHealth2();
      printf("Health2 (there is a healthy physical source): %c\n",
             (ulong)((uint)(eVar5 != 0) * 2 + 0x2b));
      puts("\\warning health is volatile");
    }
    goto LAB_0010ac10;
  }
  iVar2 = strCmp(argv[1],"read");
  eVar6 = 0x259;
  if (iVar2 != 0) goto LAB_0010ac14;
  eVar6 = 0x25b;
  if (argc != 5) goto LAB_0010ac10;
  iVar2 = strCmp(argv[2],"trng");
  if (iVar2 == 0) {
    pcVar8 = "trng";
LAB_0010ac6d:
    strCopy(source,pcVar8);
    uVar13 = 0;
LAB_0010ac7a:
    bVar3 = decIsValid(argv[3]);
    if (((bVar3 != 0) && (sVar7 = strLen(argv[3]), sVar7 != 0)) &&
       ((sVar7 = strLen(argv[3]), sVar7 < 5 && (sVar7 = decCLZ(argv[3]), sVar7 == 0)))) {
      uVar4 = decToU32(argv[3]);
      eVar6 = cmdFileValNotExist(1,argv + 4);
      if (eVar6 == 0) {
        file = fileOpen(argv[4],"wb");
        if (file == (file_t)0x0) {
          eVar6 = 0xcb;
        }
        else {
          uVar9 = (ulong)uVar4 << 10;
          local_850 = file;
          while (uVar9 != 0) {
            sVar7 = 0x800;
            if (uVar9 < 0x800) {
              sVar7 = uVar9;
            }
            local_848 = uVar9;
            iVar2 = strCmp(source,"trng");
            if (((iVar2 == 0) || (iVar2 = strCmp(source,"trng2"), iVar2 == 0)) ||
               ((iVar2 = strCmp(source,"sys"), iVar2 == 0 ||
                ((iVar2 = strCmp(source,"timer"), uVar13 == 0 && (iVar2 == 0)))))) {
              eVar6 = rngESRead(&local_858,buf,sVar7,source);
              if (eVar6 == 0) {
                sVar1 = local_858;
                if (local_858 == sVar7) goto LAB_0010ada6;
                eVar6 = 0xcf;
              }
LAB_0010ae82:
              fileClose(file);
              goto LAB_0010ac10;
            }
            local_840 = sVar7;
            for (sVar15 = 0; file = local_850, sVar7 = local_840, sVar1 = local_840,
                sVar15 != local_840; sVar15 = sVar15 + 1) {
              buf[sVar15] = '\0';
              tVar10 = tmTicks();
              for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
                w = 0;
                uVar9 = uVar13;
                while (bVar16 = uVar9 != 0, uVar9 = uVar9 - 1, bVar16) {
                  mtSleep(0);
                  tVar11 = tmTicks();
                  w = w ^ tVar11 - tVar10;
                  tVar10 = tVar11;
                }
                bVar3 = u64Parity(w);
                buf[sVar15] = buf[sVar15] ^ (byte)(bVar3 << ((byte)lVar12 & 0x1f));
              }
            }
LAB_0010ada6:
            local_858 = sVar1;
            sVar7 = fileWrite2(file,buf,sVar7);
            if (sVar7 != local_858) {
              eVar6 = 0xce;
              goto LAB_0010ae82;
            }
            uVar9 = local_848 - sVar7;
          }
          bVar3 = fileClose(file);
          eVar6 = 0x67;
          if (bVar3 != 0) {
            eVar6 = 0;
          }
        }
      }
    }
  }
  else {
    iVar2 = strCmp(argv[2],"trng2");
    if (iVar2 == 0) {
      pcVar8 = "trng2";
      goto LAB_0010ac6d;
    }
    iVar2 = strCmp(argv[2],"sys");
    if (iVar2 == 0) {
      pcVar8 = "sys";
      goto LAB_0010ac6d;
    }
    iVar2 = strCmp(argv[2],"timer");
    if (iVar2 == 0) {
      pcVar8 = "timer";
      goto LAB_0010ac6d;
    }
    bVar3 = strStartsWith(argv[2],"timer");
    if (bVar3 != 0) {
      strCopy(source,"timer");
      sVar7 = strLen("timer");
      pcVar8 = argv[2];
      argv[2] = pcVar8 + sVar7;
      bVar3 = decIsValid(pcVar8 + sVar7);
      if ((((bVar3 == 0) || (sVar7 = strLen(argv[2]), sVar7 == 0)) ||
          (sVar7 = strLen(argv[2]), 3 < sVar7)) || (sVar7 = decCLZ(argv[2]), sVar7 != 0))
      goto LAB_0010ac10;
      uVar4 = decToU32(argv[2]);
      uVar13 = (ulong)uVar4;
      goto LAB_0010ac7a;
    }
  }
LAB_0010ac10:
  if (eVar6 == 0) {
    return 0;
  }
LAB_0010ac14:
  pcVar8 = errMsg(eVar6);
  printf("bee2cmd/%s: %s\n","es",pcVar8);
  return eVar6;
}

Assistant:

int esMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return esUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "print"))
		code = esPrint(argc - 1, argv + 1);
	else if (strEq(argv[0], "read"))
		code = esRead(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK)
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return (int)code;
}